

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O1

void __thiscall winmd::reader::TypeSig::TypeSig(TypeSig *this,table_base *table,byte_view *data)

{
  ElementType EVar1;
  int iVar2;
  vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_> *result;
  byte_view cursor;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_58;
  table_base *local_38;
  
  local_58._0_8_ = data->m_first;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)data->m_last;
  EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  if (EVar1 == SZArray) {
    data->m_first = (uint8_t *)local_58._0_8_;
    data->m_last = (uint8_t *)
                   local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  this->m_is_szarray = EVar1 == SZArray;
  local_58._0_8_ = data->m_first;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)data->m_last;
  EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  if (EVar1 == Array) {
    data->m_first = (uint8_t *)local_58._0_8_;
    data->m_last = (uint8_t *)
                   local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  this->m_is_array = EVar1 == Array;
  local_58._0_8_ = data->m_first;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)data->m_last;
  EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  iVar2 = 0;
  if (EVar1 == Ptr) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      data->m_first = (uint8_t *)local_58._0_8_;
      data->m_last = (uint8_t *)
                     local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
    } while (EVar1 == Ptr);
  }
  this->m_ptr_count = iVar2;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._0_8_ = data->m_first;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)data->m_last;
  local_38 = table;
  EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  while ((byte)(EVar1 - CModReqd) < 2) {
    std::vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>>::
    emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              ((vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>> *)
               &this->m_cmod,&local_38,data);
    local_58._0_8_ = data->m_first;
    local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)data->m_last;
    EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  }
  local_58._0_8_ = data->m_first;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)data->m_last;
  EVar1 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  this->m_element_type = EVar1;
  ParseType(&this->m_type,table,data);
  this->m_array_rank = 0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_is_array == true) {
    parse_array_sizes(&local_58,table,data);
    this->m_array_rank = local_58.first;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->m_array_sizes,&local_58.second);
    if (local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.second.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.second.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.second.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

TypeSig(table_base const* table, byte_view& data)
            : m_is_szarray(parse_szarray(table, data))
            , m_is_array(parse_array(table, data))
            , m_ptr_count(parse_ptr(table, data))
            , m_cmod(parse_cmods(table, data))
            , m_element_type(parse_element_type(data))
            , m_type(ParseType(table, data))
        {
            if (m_is_array)
            {
                std::tie(m_array_rank, m_array_sizes) = parse_array_sizes(table, data);
            }
        }